

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

int __thiscall NodeSet::get_index(NodeSet *this,vector<int,_std::allocator<int>_> *lbl)

{
  size_type sVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  int ind;
  vector<int,_std::allocator<int>_> *lbl_local;
  NodeSet *this_local;
  
  sVar1 = std::
          map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ::count(&this->index,lbl);
  if (sVar1 == 0) {
    sVar3 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(&this->labels);
    this_local._4_4_ = (int)sVar3;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&this->labels,lbl);
    pmVar2 = std::
             map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
             ::operator[](&this->index,lbl);
    *pmVar2 = this_local._4_4_;
  }
  else {
    pmVar2 = std::
             map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
             ::operator[](&this->index,lbl);
    this_local._4_4_ = *pmVar2;
  }
  return this_local._4_4_;
}

Assistant:

int NodeSet::get_index(const std::vector<int> &lbl) {
	if (index.count(lbl)) {
		return index[lbl];
	} else {
		int ind = labels.size();
		labels.push_back(lbl);
		index[lbl] = ind;
		return ind;
	}
}